

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O2

void amrex::VisMF::Initialize(void)

{
  allocator local_81;
  int headerVersion;
  ParmParse pp;
  
  if ((anonymous_namespace)::initialized == '\0') {
    nOutFiles = 1;
    nMFFileInStreams = nOutFiles;
    ExecOnFinalize((PTR_TO_VOID_FUNC)0x4fbdbc);
    std::__cxx11::string::string((string *)&headerVersion,"vismf",&local_81);
    ParmParse::ParmParse(&pp,(string *)&headerVersion);
    std::__cxx11::string::~string((string *)&headerVersion);
    ParmParse::queryAdd<int,_0>(&pp,"v",&verbose);
    headerVersion = currentVersion;
    ParmParse::queryAdd<int,_0>(&pp,"headerversion",&headerVersion);
    if (headerVersion != currentVersion) {
      currentVersion = headerVersion;
    }
    ParmParse::queryAdd<bool,_0>(&pp,"groupsets",(bool *)&groupSets);
    ParmParse::queryAdd<bool,_0>(&pp,"setbuf",(bool *)&setBuf);
    ParmParse::queryAdd<bool,_0>(&pp,"usesingleread",(bool *)&useSingleRead);
    ParmParse::queryAdd<bool,_0>(&pp,"usesinglewrite",(bool *)&useSingleWrite);
    ParmParse::queryAdd<bool,_0>(&pp,"checkfilepositions",(bool *)&checkFilePositions);
    ParmParse::queryAdd<bool,_0>(&pp,"usepersistentifstreams",(bool *)&usePersistentIFStreams);
    ParmParse::queryAdd<bool,_0>(&pp,"usesynchronousreads",(bool *)&useSynchronousReads);
    ParmParse::queryAdd<bool,_0>(&pp,"usedynamicsetselection",(bool *)&useDynamicSetSelection);
    ParmParse::queryAdd<long,_0>(&pp,"iobuffersize",&VisMFBuffer::ioBufferSize);
    ParmParse::queryAdd<bool,_0>(&pp,"allowsparsewrites",(bool *)&allowSparseWrites);
    (anonymous_namespace)::initialized = '\x01';
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&pp);
  }
  return;
}

Assistant:

void
VisMF::Initialize ()
{
    if(initialized) {
      return;
    }
    //
    // Use the same defaults as in Amr.cpp.
    //
    VisMF::SetNOutFiles(nOutFiles);

    VisMF::SetMFFileInStreams(nMFFileInStreams);

    amrex::ExecOnFinalize(VisMF::Finalize);

    ParmParse pp("vismf");
    pp.queryAdd("v",verbose);

    int headerVersion(currentVersion);
    pp.queryAdd("headerversion", headerVersion);
    if(headerVersion != currentVersion) {
      currentVersion = static_cast<VisMF::Header::Version> (headerVersion);
    }

    pp.queryAdd("groupsets", groupSets);
    pp.queryAdd("setbuf", setBuf);
    pp.queryAdd("usesingleread", useSingleRead);
    pp.queryAdd("usesinglewrite", useSingleWrite);
    pp.queryAdd("checkfilepositions", checkFilePositions);
    pp.queryAdd("usepersistentifstreams", usePersistentIFStreams);
    pp.queryAdd("usesynchronousreads", useSynchronousReads);
    pp.queryAdd("usedynamicsetselection", useDynamicSetSelection);
    pp.queryAdd("iobuffersize", ioBufferSize);
    pp.queryAdd("allowsparsewrites", allowSparseWrites);

    initialized = true;
}